

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakeLanguageCommand.cxx
# Opt level: O2

bool cmCMakeLanguageCommand
               (vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *args,
               cmExecutionStatus *status)

{
  size_t sVar1;
  pointer pcVar2;
  bool bVar3;
  bool bVar4;
  LogLevel LVar5;
  cmState *this;
  string *psVar6;
  cmGlobalGenerator *this_00;
  static_string_view *psVar7;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var8;
  cmListFileContext *pcVar9;
  LogLevel level;
  _Alloc_hider value;
  pointer pbVar10;
  SetProviderArgs *pSVar11;
  string *id;
  size_t sVar12;
  pointer pbVar13;
  undefined8 this_01;
  long lVar14;
  cmMakefile *pcVar15;
  undefined1 uVar16;
  string_view name;
  string_view name_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_04;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_05;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_06;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_07;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_08;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_09;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_10;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_11;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __y_01;
  basic_string_view<char,_std::char_traits<char>_> __y_02;
  basic_string_view<char,_std::char_traits<char>_> __y_03;
  basic_string_view<char,_std::char_traits<char>_> __y_04;
  basic_string_view<char,_std::char_traits<char>_> __y_05;
  basic_string_view<char,_std::char_traits<char>_> __y_06;
  basic_string_view<char,_std::char_traits<char>_> __y_07;
  basic_string_view<char,_std::char_traits<char>_> __y_08;
  basic_string_view<char,_std::char_traits<char>_> __y_09;
  basic_string_view<char,_std::char_traits<char>_> __y_10;
  basic_string_view<char,_std::char_traits<char>_> __y_11;
  string_view value_00;
  string_view separator;
  string_view value_01;
  string_view value_02;
  string_view value_03;
  size_t expArg;
  SetProviderArgs parsedArgs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expArgs;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> ids;
  string fcmasProperty;
  cmDependencyProvider local_2d0;
  Command command;
  cmArgumentParser<SetProviderArgs> ArgsParser;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unparsed;
  string local_1d8;
  optional<(anonymous_namespace)::Defer> maybeDefer;
  vector<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_> methods;
  cmListFileFunction func;
  size_t rawArg;
  string local_108;
  anon_class_32_4_cfdc72da finishArgs;
  __shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2> local_c8;
  undefined1 local_b8 [72];
  bool local_70;
  anon_class_40_5_733c87e0 moreArgs;
  static_string_view local_40;
  
  finishArgs.expArgs = &expArgs;
  expArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  finishArgs.rawArg = &rawArg;
  rawArg = 0;
  moreArgs.expArg = &expArg;
  expArg = 0;
  expArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  expArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  finishArgs.args = args;
  finishArgs.status = status;
  moreArgs.expArgs = finishArgs.expArgs;
  moreArgs.rawArg = finishArgs.rawArg;
  moreArgs.args = args;
  moreArgs.status = status;
  bVar3 = cmCMakeLanguageCommand::anon_class_40_5_733c87e0::operator()(&moreArgs);
  if (!bVar3) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ArgsParser,"called with incorrect number of arguments",
               (allocator<char> *)&maybeDefer);
    anon_unknown.dwarf_b986de::FatalError(status,(string *)&ArgsParser);
LAB_002c2931:
    std::__cxx11::string::~string((string *)&ArgsParser);
    uVar16 = 0;
    goto LAB_002c403d;
  }
  __x._M_str = expArgs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[expArg]._M_dataplus._M_p;
  __x._M_len = expArgs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[expArg]._M_string_length;
  __y._M_str = "SET_DEPENDENCY_PROVIDER";
  __y._M_len = 0x17;
  bVar3 = std::operator==(__x,__y);
  if (!bVar3) {
    maybeDefer.super__Optional_base<(anonymous_namespace)::Defer,_false,_false>._M_payload.
    super__Optional_payload<(anonymous_namespace)::Defer,_true,_false,_false>.
    super__Optional_payload_base<(anonymous_namespace)::Defer>._72_8_ =
         maybeDefer.super__Optional_base<(anonymous_namespace)::Defer,_false,_false>._M_payload.
         super__Optional_payload<(anonymous_namespace)::Defer,_true,_false,_false>.
         super__Optional_payload_base<(anonymous_namespace)::Defer>._72_8_ & 0xffffffffffffff00;
    __x_00._M_str =
         expArgs.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[expArg]._M_dataplus._M_p;
    __x_00._M_len =
         expArgs.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[expArg]._M_string_length;
    __y_00._M_str = "DEFER";
    __y_00._M_len = 5;
    bVar3 = std::operator==(__x_00,__y_00);
    if (!bVar3) goto LAB_002c379d;
    expArg = expArg + 1;
    bVar3 = cmCMakeLanguageCommand::anon_class_40_5_733c87e0::operator()(&moreArgs);
    if (bVar3) {
      ArgsParser.super_Base.Bindings.Keywords.
      super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
      .
      super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)((long)&ArgsParser.super_Base.Bindings.Keywords.
                            super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                            .
                            super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                            ._M_impl + 0x10);
      ArgsParser.super_Base.Bindings.Keywords.
      super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
      .
      super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      ArgsParser.super_Base.Bindings.Keywords.
      super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
      .
      super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
      ArgsParser.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_functor._8_8_ =
           &ArgsParser.super_Base.Bindings.KeywordMissingValue._M_invoker;
      ArgsParser.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_manager =
           (_Manager_type)0x0;
      ArgsParser.super_Base.Bindings.KeywordMissingValue._M_invoker._0_1_ = 0;
      ArgsParser.super_Base.Bindings.ParsedKeyword.super__Function_base._M_functor._8_8_ = 0;
LAB_002c29d7:
      do {
        bVar3 = cmCMakeLanguageCommand::anon_class_40_5_733c87e0::operator()(&moreArgs);
        if ((!bVar3) ||
           (__x_01._M_str =
                 expArgs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[expArg]._M_dataplus._M_p,
           __x_01._M_len =
                expArgs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[expArg]._M_string_length,
           __y_01._M_str = "CALL", __y_01._M_len = 4, bVar3 = std::operator==(__x_01,__y_01), bVar3)
           ) {
          bVar3 = cmCMakeLanguageCommand::anon_class_40_5_733c87e0::operator()(&moreArgs);
          if ((!bVar3) ||
             (__x_09._M_str =
                   expArgs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[expArg]._M_dataplus._M_p,
             __x_09._M_len =
                  expArgs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[expArg]._M_string_length,
             __y_09._M_str = "CALL", __y_09._M_len = 4, bVar3 = std::operator==(__x_09,__y_09),
             !bVar3)) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&parsedArgs,"DEFER must be followed by a CALL argument",
                       (allocator<char> *)&local_2d0);
            anon_unknown.dwarf_b986de::FatalError(status,&parsedArgs.Command);
            goto LAB_002c3778;
          }
          if (maybeDefer.super__Optional_base<(anonymous_namespace)::Defer,_false,_false>._M_payload
              .super__Optional_payload<(anonymous_namespace)::Defer,_true,_false,_false>.
              super__Optional_payload_base<(anonymous_namespace)::Defer>._M_engaged == true) {
            std::__cxx11::string::operator=((string *)&maybeDefer,(string *)&ArgsParser);
            std::__cxx11::string::operator=
                      ((string *)
                       &maybeDefer.super__Optional_base<(anonymous_namespace)::Defer,_false,_false>.
                        _M_payload.
                        super__Optional_payload<(anonymous_namespace)::Defer,_true,_false,_false>.
                        super__Optional_payload_base<(anonymous_namespace)::Defer>._M_payload.
                        _M_value.IdVar,
                       (string *)
                       (ArgsParser.super_Base.Bindings.KeywordMissingValue.super__Function_base.
                        _M_functor._M_pod_data + 8));
            maybeDefer.super__Optional_base<(anonymous_namespace)::Defer,_false,_false>._M_payload.
            super__Optional_payload<(anonymous_namespace)::Defer,_true,_false,_false>.
            super__Optional_payload_base<(anonymous_namespace)::Defer>._M_payload._M_value.Directory
                 = (cmMakefile *)
                   ArgsParser.super_Base.Bindings.ParsedKeyword.super__Function_base._M_functor.
                   _8_8_;
          }
          else {
            std::_Optional_payload_base<(anonymous_namespace)::Defer>::
            _M_construct<(anonymous_namespace)::Defer>
                      ((_Optional_payload_base<(anonymous_namespace)::Defer> *)&maybeDefer,
                       (Defer *)&ArgsParser);
          }
          bVar3 = true;
          goto LAB_002c3785;
        }
        __x_02._M_str =
             expArgs.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[expArg]._M_dataplus._M_p;
        __x_02._M_len =
             expArgs.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[expArg]._M_string_length;
        __y_02._M_str = "CANCEL_CALL";
        __y_02._M_len = 0xb;
        bVar3 = std::operator==(__x_02,__y_02);
        if (((bVar3) ||
            (__x_03._M_str =
                  expArgs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[expArg]._M_dataplus._M_p,
            __x_03._M_len =
                 expArgs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[expArg]._M_string_length,
            __y_03._M_str = "GET_CALL_IDS", __y_03._M_len = 0xc,
            bVar3 = std::operator==(__x_03,__y_03), bVar3)) ||
           (__x_04._M_str =
                 expArgs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[expArg]._M_dataplus._M_p,
           __x_04._M_len =
                expArgs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[expArg]._M_string_length,
           __y_04._M_str = "GET_CALL", __y_04._M_len = 8, bVar3 = std::operator==(__x_04,__y_04),
           bVar3)) {
          if (ArgsParser.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_manager !=
              (_Manager_type)0x0 ||
              ArgsParser.super_Base.Bindings.Keywords.
              super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
              .
              super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
            parsedArgs.Command._M_dataplus._M_p = &DAT_00000006;
            parsedArgs.Command._M_string_length = (size_type)anon_var_dwarf_b98c4d;
            local_2d0.Command._M_string_length =
                 (size_type)
                 expArgs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[expArg]._M_dataplus._M_p;
            local_2d0.Command._M_dataplus._M_p =
                 (pointer)expArgs.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[expArg]._M_string_length;
            fcmasProperty._M_dataplus._M_p = &DAT_0000001e;
            fcmasProperty._M_string_length = (size_type)anon_var_dwarf_b98c59;
            cmStrCat<cm::static_string_view>
                      ((string *)&ids,(cmAlphaNum *)&parsedArgs,(cmAlphaNum *)&local_2d0,
                       (static_string_view *)&fcmasProperty);
            anon_unknown.dwarf_b986de::FatalError(status,(string *)&ids);
            goto LAB_002c3716;
          }
          cmCMakeLanguageCommand::anon_class_32_4_cfdc72da::operator()(&finishArgs);
          sVar12 = expArg;
          this_01 = ArgsParser.super_Base.Bindings.ParsedKeyword.super__Function_base._M_functor.
                    _8_8_;
          if (ArgsParser.super_Base.Bindings.ParsedKeyword.super__Function_base._M_functor._8_8_ ==
              0) {
            this_01 = status->Makefile;
          }
          __x_08._M_str =
               expArgs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[expArg]._M_dataplus._M_p;
          __x_08._M_len =
               expArgs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[expArg]._M_string_length;
          __y_08._M_str = "CANCEL_CALL";
          __y_08._M_len = 0xb;
          bVar3 = std::operator==(__x_08,__y_08);
          pbVar10 = expArgs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          if (bVar3) {
            psVar6 = expArgs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + sVar12;
            goto LAB_002c2e95;
          }
          __x_10._M_str =
               expArgs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[sVar12]._M_dataplus._M_p;
          __x_10._M_len =
               expArgs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[sVar12]._M_string_length;
          __y_10._M_str = "GET_CALL_IDS";
          __y_10._M_len = 0xc;
          bVar3 = std::operator==(__x_10,__y_10);
          pbVar10 = expArgs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (bVar3) {
            lVar14 = (long)expArgs.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)expArgs.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5;
            if (sVar12 + 1 == lVar14) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&parsedArgs,"DEFER GET_CALL_IDS missing output variable",
                         (allocator<char> *)&local_2d0);
              anon_unknown.dwarf_b986de::FatalError(status,&parsedArgs.Command);
              goto LAB_002c3778;
            }
            if (sVar12 + 2 != lVar14) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&parsedArgs,"DEFER GET_CALL_IDS given too many arguments",
                         (allocator<char> *)&local_2d0);
              anon_unknown.dwarf_b986de::FatalError(status,&parsedArgs.Command);
              goto LAB_002c3778;
            }
            cmMakefile::DeferGetCallIds_abi_cxx11_(&ids,(cmMakefile *)this_01);
            if (ids.
                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ._M_engaged == false) {
              parsedArgs.Command._M_dataplus._M_p = (pointer)0x2f;
              parsedArgs.Command._M_string_length = (size_type)anon_var_dwarf_b99025;
              psVar6 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_((cmMakefile *)this_01);
              local_2d0.Command._M_string_length = (size_type)(psVar6->_M_dataplus)._M_p;
              local_2d0.Command._M_dataplus._M_p = (pointer)psVar6->_M_string_length;
              command.super__Function_base._M_functor._M_unused._M_member_pointer = 0xe;
              command.super__Function_base._M_functor._8_8_ = anon_var_dwarf_b98fda;
              cmStrCat<cm::static_string_view>
                        (&fcmasProperty,(cmAlphaNum *)&parsedArgs,(cmAlphaNum *)&local_2d0,
                         (static_string_view *)&command);
              anon_unknown.dwarf_b986de::FatalError(status,&fcmasProperty);
LAB_002c4144:
              std::__cxx11::string::~string((string *)&fcmasProperty);
              uVar16 = ids.
                       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                       ._M_payload.
                       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ._M_engaged;
            }
            else {
              value_00._M_str =
                   (char *)ids.
                           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                           ._M_payload.
                           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                           .
                           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ._M_payload._M_value._M_dataplus._M_p;
              value_00._M_len =
                   ids.
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   ._M_payload.
                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ._M_payload._M_value._M_string_length;
              cmMakefile::AddDefinition(status->Makefile,pbVar10 + sVar12 + 1,value_00);
              uVar16 = ids.
                       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                       ._M_payload.
                       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ._M_engaged;
            }
          }
          else {
            __x_11._M_str =
                 expArgs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[sVar12]._M_dataplus._M_p;
            __x_11._M_len =
                 expArgs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[sVar12]._M_string_length;
            __y_11._M_str = "GET_CALL";
            __y_11._M_len = 8;
            bVar3 = std::operator==(__x_11,__y_11);
            pbVar10 = expArgs.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if (!bVar3) {
              parsedArgs.Command._M_dataplus._M_p = (pointer)0x19;
              parsedArgs.Command._M_string_length = (size_type)anon_var_dwarf_b9908e;
              local_2d0.Command._M_string_length =
                   (size_type)
                   expArgs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[sVar12]._M_dataplus._M_p;
              local_2d0.Command._M_dataplus._M_p =
                   (pointer)expArgs.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[sVar12]._M_string_length;
              cmStrCat<>((string *)&ids,(cmAlphaNum *)&parsedArgs,(cmAlphaNum *)&local_2d0);
              anon_unknown.dwarf_b986de::FatalError(status,(string *)&ids);
              goto LAB_002c3716;
            }
            lVar14 = (long)expArgs.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)expArgs.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5;
            if (sVar12 + 1 == lVar14) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&parsedArgs,"DEFER GET_CALL missing id",
                         (allocator<char> *)&local_2d0);
              anon_unknown.dwarf_b986de::FatalError(status,&parsedArgs.Command);
              goto LAB_002c3778;
            }
            if (sVar12 + 2 == lVar14) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&parsedArgs,"DEFER GET_CALL missing output variable",
                         (allocator<char> *)&local_2d0);
              anon_unknown.dwarf_b986de::FatalError(status,&parsedArgs.Command);
              goto LAB_002c3778;
            }
            if (sVar12 + 3 != lVar14) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&parsedArgs,"DEFER GET_CALL given too many arguments",
                         (allocator<char> *)&local_2d0);
              anon_unknown.dwarf_b986de::FatalError(status,&parsedArgs.Command);
              goto LAB_002c3778;
            }
            psVar6 = expArgs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + sVar12 + 1;
            if ((pointer)psVar6->_M_string_length == (pointer)0x0) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&parsedArgs,"DEFER GET_CALL id may not be empty",
                         (allocator<char> *)&local_2d0);
              anon_unknown.dwarf_b986de::FatalError(status,&parsedArgs.Command);
              goto LAB_002c3778;
            }
            pbVar13 = (pointer)(psVar6->_M_dataplus)._M_p;
            if ((byte)(*(char *)&(pbVar13->_M_dataplus)._M_p + 0xbfU) < 0x1a) {
              parsedArgs.Command._M_dataplus._M_p = (pointer)0x22;
              parsedArgs.Command._M_string_length = (size_type)anon_var_dwarf_b99078;
              local_2d0.Command._M_dataplus._M_p = (pointer)psVar6->_M_string_length;
              local_2d0.Command._M_string_length = (size_type)pbVar13;
              cmStrCat<>((string *)&ids,(cmAlphaNum *)&parsedArgs,(cmAlphaNum *)&local_2d0);
              anon_unknown.dwarf_b986de::FatalError(status,(string *)&ids);
              goto LAB_002c3716;
            }
            cmMakefile::DeferGetCall(&ids,(cmMakefile *)this_01,psVar6);
            if (ids.
                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ._M_engaged == false) {
              parsedArgs.Command._M_dataplus._M_p = (pointer)0x2b;
              parsedArgs.Command._M_string_length = (size_type)anon_var_dwarf_b99083;
              psVar6 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_((cmMakefile *)this_01);
              local_2d0.Command._M_string_length = (size_type)(psVar6->_M_dataplus)._M_p;
              local_2d0.Command._M_dataplus._M_p = (pointer)psVar6->_M_string_length;
              command.super__Function_base._M_functor._M_unused._M_member_pointer = 0xe;
              command.super__Function_base._M_functor._8_8_ = anon_var_dwarf_b98fda;
              cmStrCat<cm::static_string_view>
                        (&fcmasProperty,(cmAlphaNum *)&parsedArgs,(cmAlphaNum *)&local_2d0,
                         (static_string_view *)&command);
              anon_unknown.dwarf_b986de::FatalError(status,&fcmasProperty);
              goto LAB_002c4144;
            }
            value_03._M_str =
                 (char *)ids.
                         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                         ._M_payload.
                         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                         .
                         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ._M_payload._M_value._M_dataplus._M_p;
            value_03._M_len =
                 ids.
                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._M_payload._M_value._M_string_length;
            cmMakefile::AddDefinition(status->Makefile,pbVar10 + sVar12 + 2,value_03);
            uVar16 = ids.
                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                     ._M_payload.
                     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ._M_engaged;
          }
          std::
          _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&ids);
          goto LAB_002c415b;
        }
        __x_05._M_str =
             expArgs.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[expArg]._M_dataplus._M_p;
        __x_05._M_len =
             expArgs.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[expArg]._M_string_length;
        __y_05._M_str = "DIRECTORY";
        __y_05._M_len = 9;
        bVar3 = std::operator==(__x_05,__y_05);
        if (bVar3) {
          expArg = expArg + 1;
          if (ArgsParser.super_Base.Bindings.ParsedKeyword.super__Function_base._M_functor._8_8_ !=
              0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&parsedArgs,"DEFER given multiple DIRECTORY arguments",
                       (allocator<char> *)&local_2d0);
            anon_unknown.dwarf_b986de::FatalError(status,&parsedArgs.Command);
            goto LAB_002c3778;
          }
          bVar3 = cmCMakeLanguageCommand::anon_class_40_5_733c87e0::operator()(&moreArgs);
          if (!bVar3) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&parsedArgs,"DEFER DIRECTORY missing value",
                       (allocator<char> *)&local_2d0);
            anon_unknown.dwarf_b986de::FatalError(status,&parsedArgs.Command);
            goto LAB_002c3778;
          }
          pbVar10 = expArgs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + expArg;
          expArg = expArg + 1;
          std::__cxx11::string::string((string *)&ids,(string *)pbVar10);
          if (ids.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_payload._M_value._M_string_length == 0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&parsedArgs,"DEFER DIRECTORY may not be empty",
                       (allocator<char> *)&local_2d0);
            anon_unknown.dwarf_b986de::FatalError(status,&parsedArgs.Command);
            pSVar11 = &parsedArgs;
          }
          else {
            psVar6 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(status->Makefile);
            cmsys::SystemTools::CollapseFullPath(&parsedArgs.Command,(string *)&ids,psVar6);
            std::__cxx11::string::operator=((string *)&ids,(string *)&parsedArgs);
            std::__cxx11::string::~string((string *)&parsedArgs);
            this_00 = cmMakefile::GetGlobalGenerator(status->Makefile);
            ArgsParser.super_Base.Bindings.ParsedKeyword.super__Function_base._M_functor._8_8_ =
                 cmGlobalGenerator::FindMakefile(this_00,(string *)&ids);
            if ((cmMakefile *)
                ArgsParser.super_Base.Bindings.ParsedKeyword.super__Function_base._M_functor._8_8_
                != (cmMakefile *)0x0) {
              std::__cxx11::string::~string((string *)&ids);
              goto LAB_002c29d7;
            }
            parsedArgs.Command._M_dataplus._M_p = &DAT_00000013;
            parsedArgs.Command._M_string_length = (size_type)anon_var_dwarf_b98cdb;
            local_2d0.Command._M_dataplus._M_p =
                 (pointer)ids.
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ._M_payload._M_value._M_string_length;
            local_2d0.Command._M_string_length =
                 (size_type)
                 ids.
                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._M_payload._M_value._M_dataplus._M_p;
            command.super__Function_base._M_functor._M_unused._M_member_pointer = 0x10;
            command.super__Function_base._M_functor._8_8_ = anon_var_dwarf_b98cf5;
            local_1d8._M_dataplus._M_p = (pointer)0x23;
            local_1d8._M_string_length = 0x62d5a6;
            cmStrCat<cm::static_string_view,cm::static_string_view>
                      (&fcmasProperty,(cmAlphaNum *)&parsedArgs,(cmAlphaNum *)&local_2d0,
                       (static_string_view *)&command,(static_string_view *)&local_1d8);
            anon_unknown.dwarf_b986de::FatalError(status,&fcmasProperty);
            pSVar11 = (SetProviderArgs *)&fcmasProperty;
          }
          std::__cxx11::string::~string((string *)pSVar11);
          goto LAB_002c3716;
        }
        __x_06._M_str =
             expArgs.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[expArg]._M_dataplus._M_p;
        __x_06._M_len =
             expArgs.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[expArg]._M_string_length;
        __y_06._M_str = "ID";
        __y_06._M_len = 2;
        bVar3 = std::operator==(__x_06,__y_06);
        if (!bVar3) {
          __x_07._M_str =
               expArgs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[expArg]._M_dataplus._M_p;
          __x_07._M_len =
               expArgs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[expArg]._M_string_length;
          __y_07._M_str = "ID_VAR";
          __y_07._M_len = 6;
          bVar3 = std::operator==(__x_07,__y_07);
          if (!bVar3) {
            parsedArgs.Command._M_dataplus._M_p = &DAT_00000018;
            parsedArgs.Command._M_string_length = (size_type)anon_var_dwarf_b98ddb;
            local_2d0.Command._M_string_length =
                 (size_type)
                 expArgs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[expArg]._M_dataplus._M_p;
            local_2d0.Command._M_dataplus._M_p =
                 (pointer)expArgs.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[expArg]._M_string_length;
            cmStrCat<>((string *)&ids,(cmAlphaNum *)&parsedArgs,(cmAlphaNum *)&local_2d0);
            anon_unknown.dwarf_b986de::FatalError(status,(string *)&ids);
            goto LAB_002c3716;
          }
          expArg = expArg + 1;
          if (ArgsParser.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_manager !=
              (_Manager_type)0x0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&parsedArgs,"DEFER given multiple ID_VAR arguments",
                       (allocator<char> *)&local_2d0);
            anon_unknown.dwarf_b986de::FatalError(status,&parsedArgs.Command);
            goto LAB_002c3778;
          }
          bVar3 = cmCMakeLanguageCommand::anon_class_40_5_733c87e0::operator()(&moreArgs);
          if (!bVar3) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&parsedArgs,"DEFER ID_VAR missing variable name",
                       (allocator<char> *)&local_2d0);
            anon_unknown.dwarf_b986de::FatalError(status,&parsedArgs.Command);
            goto LAB_002c3778;
          }
          expArg = expArg + 1;
          std::__cxx11::string::_M_assign
                    ((string *)
                     (ArgsParser.super_Base.Bindings.KeywordMissingValue.super__Function_base.
                      _M_functor._M_pod_data + 8));
          if (ArgsParser.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_manager ==
              (_Manager_type)0x0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&parsedArgs,"DEFER ID_VAR may not be empty",
                       (allocator<char> *)&local_2d0);
            anon_unknown.dwarf_b986de::FatalError(status,&parsedArgs.Command);
            goto LAB_002c3778;
          }
          goto LAB_002c29d7;
        }
        expArg = expArg + 1;
        if (ArgsParser.super_Base.Bindings.Keywords.
            super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
            .
            super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&parsedArgs,"DEFER given multiple ID arguments",
                     (allocator<char> *)&local_2d0);
          anon_unknown.dwarf_b986de::FatalError(status,&parsedArgs.Command);
          goto LAB_002c3778;
        }
        bVar3 = cmCMakeLanguageCommand::anon_class_40_5_733c87e0::operator()(&moreArgs);
        if (!bVar3) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&parsedArgs,"DEFER ID missing value",(allocator<char> *)&local_2d0);
          anon_unknown.dwarf_b986de::FatalError(status,&parsedArgs.Command);
          goto LAB_002c3778;
        }
        expArg = expArg + 1;
        std::__cxx11::string::_M_assign((string *)&ArgsParser);
        if (ArgsParser.super_Base.Bindings.Keywords.
            super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
            .
            super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&parsedArgs,"DEFER ID may not be empty",(allocator<char> *)&local_2d0
                    );
          anon_unknown.dwarf_b986de::FatalError(status,&parsedArgs.Command);
          goto LAB_002c3778;
        }
      } while (0x19 < (byte)((char)((ArgsParser.super_Base.Bindings.Keywords.
                                     super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                                     .
                                     super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->first)._M_len +
                            0xbfU));
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&parsedArgs,"DEFER ID may not start in A-Z.",
                 (allocator<char> *)&local_2d0);
      anon_unknown.dwarf_b986de::FatalError(status,&parsedArgs.Command);
LAB_002c3778:
      pSVar11 = &parsedArgs;
      goto LAB_002c377d;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ArgsParser,"DEFER requires at least one argument",
               (allocator<char> *)&parsedArgs);
    anon_unknown.dwarf_b986de::FatalError(status,(string *)&ArgsParser);
    goto LAB_002c3aaf;
  }
  cmCMakeLanguageCommand::anon_class_32_4_cfdc72da::operator()(&finishArgs);
  this = cmMakefile::GetState(status->Makefile);
  if (this->ProcessingTopLevelIncludes == false) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ArgsParser,
               "Dependency providers can only be set as part of the first call to project(). More specifically, cmake_language(SET_DEPENDENCY_PROVIDER) can only be called while the first project() command processes files listed in CMAKE_PROJECT_TOP_LEVEL_INCLUDES."
               ,(allocator<char> *)&maybeDefer);
    anon_unknown.dwarf_b986de::FatalError(status,(string *)&ArgsParser);
    goto LAB_002c2931;
  }
  maybeDefer.super__Optional_base<(anonymous_namespace)::Defer,_false,_false>._M_payload.
  super__Optional_payload<(anonymous_namespace)::Defer,_true,_false,_false>.
  super__Optional_payload_base<(anonymous_namespace)::Defer>._M_payload._M_value.Directory =
       (cmMakefile *)0x0;
  maybeDefer.super__Optional_base<(anonymous_namespace)::Defer,_false,_false>._M_payload.
  super__Optional_payload<(anonymous_namespace)::Defer,_true,_false,_false>.
  super__Optional_payload_base<(anonymous_namespace)::Defer>._M_engaged = false;
  maybeDefer.super__Optional_base<(anonymous_namespace)::Defer,_false,_false>._M_payload.
  super__Optional_payload<(anonymous_namespace)::Defer,_true,_false,_false>.
  super__Optional_payload_base<(anonymous_namespace)::Defer>._73_7_ = 0;
  maybeDefer.super__Optional_base<(anonymous_namespace)::Defer,_false,_false>._M_payload.
  super__Optional_payload<(anonymous_namespace)::Defer,_true,_false,_false>.
  super__Optional_payload_base<(anonymous_namespace)::Defer>._M_payload._48_8_ = 0;
  maybeDefer.super__Optional_base<(anonymous_namespace)::Defer,_false,_false>._M_payload.
  super__Optional_payload<(anonymous_namespace)::Defer,_true,_false,_false>.
  super__Optional_payload_base<(anonymous_namespace)::Defer>._M_payload._56_8_ = 0;
  maybeDefer.super__Optional_base<(anonymous_namespace)::Defer,_false,_false>._M_payload.
  super__Optional_payload<(anonymous_namespace)::Defer,_true,_false,_false>.
  super__Optional_payload_base<(anonymous_namespace)::Defer>._M_payload._M_value.IdVar._M_dataplus.
  _M_p = (_Alloc_hider)(pointer)0x0;
  maybeDefer.super__Optional_base<(anonymous_namespace)::Defer,_false,_false>._M_payload.
  super__Optional_payload<(anonymous_namespace)::Defer,_true,_false,_false>.
  super__Optional_payload_base<(anonymous_namespace)::Defer>._M_payload._M_value.IdVar.
  _M_string_length = 0;
  maybeDefer.super__Optional_base<(anonymous_namespace)::Defer,_false,_false>._M_payload.
  super__Optional_payload<(anonymous_namespace)::Defer,_true,_false,_false>.
  super__Optional_payload_base<(anonymous_namespace)::Defer>._M_payload._16_8_ = 0;
  maybeDefer.super__Optional_base<(anonymous_namespace)::Defer,_false,_false>._M_payload.
  super__Optional_payload<(anonymous_namespace)::Defer,_true,_false,_false>.
  super__Optional_payload_base<(anonymous_namespace)::Defer>._M_payload._24_8_ = 0;
  maybeDefer.super__Optional_base<(anonymous_namespace)::Defer,_false,_false>._M_payload.
  super__Optional_payload<(anonymous_namespace)::Defer,_true,_false,_false>.
  super__Optional_payload_base<(anonymous_namespace)::Defer>._M_payload._M_value.Id._M_dataplus._M_p
       = (_Alloc_hider)(pointer)0x0;
  maybeDefer.super__Optional_base<(anonymous_namespace)::Defer,_false,_false>._M_payload.
  super__Optional_payload<(anonymous_namespace)::Defer,_true,_false,_false>.
  super__Optional_payload_base<(anonymous_namespace)::Defer>._M_payload._M_value.Id._M_string_length
       = 0;
  parsedArgs.Command._M_dataplus._M_p = (pointer)0x0;
  parsedArgs.Command._M_string_length = 0;
  parsedArgs.Command.field_2._8_8_ =
       std::
       _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmArgumentParser.h:229:28)>
       ::_M_invoke;
  parsedArgs.Command.field_2._M_allocated_capacity =
       (size_type)
       std::
       _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmArgumentParser.h:229:28)>
       ::_M_manager;
  name._M_str = "SET_DEPENDENCY_PROVIDER";
  name._M_len = 0x17;
  ArgumentParser::Base::Bind((Base *)&maybeDefer,name,(KeywordAction *)&parsedArgs);
  std::_Function_base::~_Function_base((_Function_base *)&parsedArgs);
  parsedArgs.Command._M_string_length = 0;
  parsedArgs.Command._M_dataplus._M_p = (pointer)0x20;
  parsedArgs.Command.field_2._8_8_ =
       std::
       _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmArgumentParser.h:229:28)>
       ::_M_invoke;
  parsedArgs.Command.field_2._M_allocated_capacity =
       (size_type)
       std::
       _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmArgumentParser.h:229:28)>
       ::_M_manager;
  name_00._M_str = "SUPPORTED_METHODS";
  name_00._M_len = 0x11;
  ArgumentParser::Base::Bind((Base *)&maybeDefer,name_00,(KeywordAction *)&parsedArgs);
  std::_Function_base::~_Function_base((_Function_base *)&parsedArgs);
  ArgumentParser::ActionMap::ActionMap((ActionMap *)&ArgsParser,(ActionMap *)&maybeDefer);
  ArgumentParser::ActionMap::~ActionMap((ActionMap *)&maybeDefer);
  maybeDefer.super__Optional_base<(anonymous_namespace)::Defer,_false,_false>._M_payload.
  super__Optional_payload<(anonymous_namespace)::Defer,_true,_false,_false>.
  super__Optional_payload_base<(anonymous_namespace)::Defer>._M_payload._16_8_ = &unparsed;
  unparsed.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  unparsed.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  unparsed.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  parsedArgs.Command._M_dataplus._M_p = (pointer)&parsedArgs.Command.field_2;
  parsedArgs.Command._M_string_length = 0;
  parsedArgs.Command.field_2._M_allocated_capacity =
       parsedArgs.Command.field_2._M_allocated_capacity & 0xffffffffffffff00;
  parsedArgs.Methods.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  maybeDefer.super__Optional_base<(anonymous_namespace)::Defer,_false,_false>._M_payload.
  super__Optional_payload<(anonymous_namespace)::Defer,_true,_false,_false>.
  super__Optional_payload_base<(anonymous_namespace)::Defer>._M_payload._M_value.Id._M_string_length
       = 0;
  parsedArgs.Methods.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  parsedArgs.Methods.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  maybeDefer.super__Optional_base<(anonymous_namespace)::Defer,_false,_false>._M_payload.
  super__Optional_payload<(anonymous_namespace)::Defer,_true,_false,_false>.
  super__Optional_payload_base<(anonymous_namespace)::Defer>._M_payload._M_value.IdVar._M_dataplus.
  _M_p = (_Alloc_hider)(pointer)0x0;
  maybeDefer.super__Optional_base<(anonymous_namespace)::Defer,_false,_false>._M_payload.
  super__Optional_payload<(anonymous_namespace)::Defer,_true,_false,_false>.
  super__Optional_payload_base<(anonymous_namespace)::Defer>._M_payload._M_value.IdVar.
  _M_string_length = 0;
  maybeDefer.super__Optional_base<(anonymous_namespace)::Defer,_false,_false>._M_payload.
  super__Optional_payload<(anonymous_namespace)::Defer,_true,_false,_false>.
  super__Optional_payload_base<(anonymous_namespace)::Defer>._M_payload._48_8_ = 0;
  maybeDefer.super__Optional_base<(anonymous_namespace)::Defer,_false,_false>._M_payload.
  super__Optional_payload<(anonymous_namespace)::Defer,_true,_false,_false>.
  super__Optional_payload_base<(anonymous_namespace)::Defer>._M_payload._56_8_ = 0;
  maybeDefer.super__Optional_base<(anonymous_namespace)::Defer,_false,_false>._M_payload.
  super__Optional_payload<(anonymous_namespace)::Defer,_true,_false,_false>.
  super__Optional_payload_base<(anonymous_namespace)::Defer>._M_payload._M_value.Directory =
       (cmMakefile *)0x0;
  maybeDefer.super__Optional_base<(anonymous_namespace)::Defer,_false,_false>._M_payload.
  super__Optional_payload<(anonymous_namespace)::Defer,_true,_false,_false>.
  super__Optional_payload_base<(anonymous_namespace)::Defer>._M_engaged = false;
  maybeDefer.super__Optional_base<(anonymous_namespace)::Defer,_false,_false>._M_payload.
  super__Optional_payload<(anonymous_namespace)::Defer,_true,_false,_false>.
  super__Optional_payload_base<(anonymous_namespace)::Defer>._73_7_ = 0;
  maybeDefer.super__Optional_base<(anonymous_namespace)::Defer,_false,_false>._M_payload.
  super__Optional_payload<(anonymous_namespace)::Defer,_true,_false,_false>.
  super__Optional_payload_base<(anonymous_namespace)::Defer>._M_payload._M_value.Id._M_dataplus._M_p
       = (_Alloc_hider)&ArgsParser;
  maybeDefer.super__Optional_base<(anonymous_namespace)::Defer,_false,_false>._M_payload.
  super__Optional_payload<(anonymous_namespace)::Defer,_true,_false,_false>.
  super__Optional_payload_base<(anonymous_namespace)::Defer>._M_payload._24_8_ = &parsedArgs;
  ArgumentParser::Instance::
  Parse<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((Instance *)&maybeDefer,&expArgs,0);
  std::_Function_base::~_Function_base
            ((_Function_base *)
             ((long)&maybeDefer.super__Optional_base<(anonymous_namespace)::Defer,_false,_false>.
                     _M_payload.
                     super__Optional_payload<(anonymous_namespace)::Defer,_true,_false,_false>.
                     super__Optional_payload_base<(anonymous_namespace)::Defer>._M_payload + 0x40));
  if (unparsed.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      unparsed.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fcmasProperty,"__FETCHCONTENT_MAKEAVAILABLE_SERIAL_PROVIDER",
               (allocator<char> *)&maybeDefer);
    if (parsedArgs.Command._M_string_length == 0) {
      if (parsedArgs.Methods.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          parsedArgs.Methods.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::_Optional_payload_base<cmDependencyProvider>::_M_reset
                  ((_Optional_payload_base<cmDependencyProvider> *)&this->DependencyProvider);
        uVar16 = true;
        cmState::SetGlobalProperty(this,&fcmasProperty,"");
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&maybeDefer,
                   "Must specify a non-empty command name when provider methods are given",
                   (allocator<char> *)&ids);
        anon_unknown.dwarf_b986de::FatalError(status,(string *)&maybeDefer);
        std::__cxx11::string::~string((string *)&maybeDefer);
        uVar16 = false;
      }
    }
    else {
      cmState::GetCommand(&command,this,&parsedArgs.Command);
      pbVar10 = parsedArgs.Methods.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (command.super__Function_base._M_manager == (_Manager_type)0x0) {
        maybeDefer.super__Optional_base<(anonymous_namespace)::Defer,_false,_false>._M_payload.
        super__Optional_payload<(anonymous_namespace)::Defer,_true,_false,_false>.
        super__Optional_payload_base<(anonymous_namespace)::Defer>._M_payload._M_value.Id.
        _M_dataplus._M_p = (_Alloc_hider)&DAT_00000009;
        maybeDefer.super__Optional_base<(anonymous_namespace)::Defer,_false,_false>._M_payload.
        super__Optional_payload<(anonymous_namespace)::Defer,_true,_false,_false>.
        super__Optional_payload_base<(anonymous_namespace)::Defer>._M_payload._M_value.Id.
        _M_string_length = (size_type)anon_var_dwarf_b98f15;
        ids.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._M_value._M_dataplus._M_p =
             (_Alloc_hider)(_Alloc_hider)parsedArgs.Command._M_string_length;
        ids.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._M_value._M_string_length = (size_type)parsedArgs.Command._M_dataplus._M_p;
        cmStrCat<char[27]>(&local_1d8,(cmAlphaNum *)&maybeDefer,(cmAlphaNum *)&ids,
                           (char (*) [27])"\" is not a defined command");
        anon_unknown.dwarf_b986de::FatalError(status,&local_1d8);
        psVar6 = &local_1d8;
LAB_002c31c4:
        std::__cxx11::string::~string((string *)psVar6);
        uVar16 = false;
      }
      else {
        if (parsedArgs.Methods.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            parsedArgs.Methods.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&maybeDefer,"Must specify at least one provider method",
                     (allocator<char> *)&ids);
          anon_unknown.dwarf_b986de::FatalError(status,(string *)&maybeDefer);
          psVar6 = (string *)&maybeDefer;
          goto LAB_002c31c4;
        }
        methods.
        super__Vector_base<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        methods.
        super__Vector_base<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        methods.
        super__Vector_base<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        bVar3 = false;
        for (pbVar13 = parsedArgs.Methods.
                       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; uVar16 = pbVar13 == pbVar10,
            !(bool)uVar16; pbVar13 = pbVar13 + 1) {
          bVar4 = std::operator==(pbVar13,"FIND_PACKAGE");
          if (bVar4) {
            maybeDefer.super__Optional_base<(anonymous_namespace)::Defer,_false,_false>._M_payload.
            super__Optional_payload<(anonymous_namespace)::Defer,_true,_false,_false>.
            super__Optional_payload_base<(anonymous_namespace)::Defer>._M_payload._M_value.Id.
            _M_dataplus._M_p =
                 (_Alloc_hider)
                 ((ulong)maybeDefer.super__Optional_base<(anonymous_namespace)::Defer,_false,_false>
                         ._M_payload.
                         super__Optional_payload<(anonymous_namespace)::Defer,_true,_false,_false>.
                         super__Optional_payload_base<(anonymous_namespace)::Defer>._M_payload.
                         _M_value.Id._M_dataplus._M_p & 0xffffffff00000000);
            std::vector<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_>
            ::emplace_back<cmDependencyProvider::Method>(&methods,(Method *)&maybeDefer);
          }
          else {
            bVar3 = std::operator==(pbVar13,"FETCHCONTENT_MAKEAVAILABLE_SERIAL");
            if (!bVar3) {
              maybeDefer.super__Optional_base<(anonymous_namespace)::Defer,_false,_false>._M_payload
              .super__Optional_payload<(anonymous_namespace)::Defer,_true,_false,_false>.
              super__Optional_payload_base<(anonymous_namespace)::Defer>._M_payload._M_value.Id.
              _M_dataplus._M_p = (_Alloc_hider)(pointer)0x24;
              maybeDefer.super__Optional_base<(anonymous_namespace)::Defer,_false,_false>._M_payload
              .super__Optional_payload<(anonymous_namespace)::Defer,_true,_false,_false>.
              super__Optional_payload_base<(anonymous_namespace)::Defer>._M_payload._M_value.Id.
              _M_string_length = (size_type)anon_var_dwarf_b98f5f;
              ids.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_payload._M_value._M_string_length = (size_type)(pbVar13->_M_dataplus)._M_p;
              ids.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)pbVar13->_M_string_length;
              cmStrCat<char[2]>(&local_1d8,(cmAlphaNum *)&maybeDefer,(cmAlphaNum *)&ids,
                                (char (*) [2])0x64cbec);
              anon_unknown.dwarf_b986de::FatalError(status,&local_1d8);
              std::__cxx11::string::~string((string *)&local_1d8);
              goto LAB_002c32de;
            }
            maybeDefer.super__Optional_base<(anonymous_namespace)::Defer,_false,_false>._M_payload.
            super__Optional_payload<(anonymous_namespace)::Defer,_true,_false,_false>.
            super__Optional_payload_base<(anonymous_namespace)::Defer>._M_payload._0_4_ = 1;
            std::vector<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_>
            ::emplace_back<cmDependencyProvider::Method>(&methods,(Method *)&maybeDefer);
            bVar3 = true;
          }
        }
        std::__cxx11::string::string((string *)&local_108,(string *)&parsedArgs);
        std::vector<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_>::
        vector((vector<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_>
                *)&func,&methods);
        cmDependencyProvider::cmDependencyProvider
                  (&local_2d0,&local_108,
                   (vector<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_>
                    *)&func);
        std::optional<cmDependencyProvider>::operator=(&this->DependencyProvider,&local_2d0);
        cmDependencyProvider::~cmDependencyProvider(&local_2d0);
        std::
        _Vector_base<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_>::
        ~_Vector_base((_Vector_base<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_>
                       *)&func);
        std::__cxx11::string::~string((string *)&local_108);
        value = parsedArgs.Command._M_dataplus;
        if (!bVar3) {
          value._M_p = "";
        }
        cmState::SetGlobalProperty(this,&fcmasProperty,value._M_p);
LAB_002c32de:
        std::
        _Vector_base<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_>::
        ~_Vector_base(&methods.
                       super__Vector_base<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_>
                     );
      }
      std::_Function_base::~_Function_base(&command.super__Function_base);
    }
    std::__cxx11::string::~string((string *)&fcmasProperty);
  }
  else {
    maybeDefer.super__Optional_base<(anonymous_namespace)::Defer,_false,_false>._M_payload.
    super__Optional_payload<(anonymous_namespace)::Defer,_true,_false,_false>.
    super__Optional_payload_base<(anonymous_namespace)::Defer>._M_payload._M_value.Id._M_dataplus.
    _M_p = (_Alloc_hider)(pointer)0x17;
    maybeDefer.super__Optional_base<(anonymous_namespace)::Defer,_false,_false>._M_payload.
    super__Optional_payload<(anonymous_namespace)::Defer,_true,_false,_false>.
    super__Optional_payload_base<(anonymous_namespace)::Defer>._M_payload._M_value.Id.
    _M_string_length = (size_type)anon_var_dwarf_b98ea3;
    ids.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_string_length =
         (size_type)
         ((unparsed.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
    ids.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_dataplus._M_p =
         (_Alloc_hider)
         (unparsed.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
    cmStrCat<char[2]>(&fcmasProperty,(cmAlphaNum *)&maybeDefer,(cmAlphaNum *)&ids,
                      (char (*) [2])0x64cbec);
    anon_unknown.dwarf_b986de::FatalError(status,&fcmasProperty);
    std::__cxx11::string::~string((string *)&fcmasProperty);
    uVar16 = false;
  }
  anon_unknown.dwarf_b986de::anon_func::SetProviderArgs::~SetProviderArgs(&parsedArgs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&unparsed);
  ArgumentParser::ActionMap::~ActionMap((ActionMap *)&ArgsParser);
  goto LAB_002c403d;
LAB_002c2e95:
  id = psVar6 + 1;
  if (id == pbVar10) {
    uVar16 = 1;
LAB_002c415b:
    bVar3 = false;
    goto LAB_002c3787;
  }
  pbVar13 = (pointer)(id->_M_dataplus)._M_p;
  if (0x19 < (byte)(*(char *)&(pbVar13->_M_dataplus)._M_p + 0xbfU)) goto LAB_002c2eb0;
  parsedArgs.Command._M_dataplus._M_p = (pointer)0x26;
  parsedArgs.Command._M_string_length = (size_type)anon_var_dwarf_b98fa8;
  local_2d0.Command._M_dataplus._M_p = (pointer)psVar6[1]._M_string_length;
  local_2d0.Command._M_string_length = (size_type)pbVar13;
  cmStrCat<>((string *)&ids,(cmAlphaNum *)&parsedArgs,(cmAlphaNum *)&local_2d0);
  anon_unknown.dwarf_b986de::FatalError(status,(string *)&ids);
  goto LAB_002c3716;
LAB_002c2eb0:
  bVar3 = cmMakefile::DeferCancelCall((cmMakefile *)this_01,id);
  psVar6 = id;
  if (!bVar3) goto code_r0x002c2ec3;
  goto LAB_002c2e95;
code_r0x002c2ec3:
  parsedArgs.Command._M_dataplus._M_p = (pointer)0x2e;
  parsedArgs.Command._M_string_length = (size_type)anon_var_dwarf_b98fc1;
  psVar6 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_((cmMakefile *)this_01);
  local_2d0.Command._M_string_length = (size_type)(psVar6->_M_dataplus)._M_p;
  local_2d0.Command._M_dataplus._M_p = (pointer)psVar6->_M_string_length;
  fcmasProperty._M_dataplus._M_p = (pointer)0xe;
  fcmasProperty._M_string_length = (size_type)anon_var_dwarf_b98fda;
  cmStrCat<cm::static_string_view>
            ((string *)&ids,(cmAlphaNum *)&parsedArgs,(cmAlphaNum *)&local_2d0,
             (static_string_view *)&fcmasProperty);
  anon_unknown.dwarf_b986de::FatalError(status,(string *)&ids);
LAB_002c3716:
  pSVar11 = (SetProviderArgs *)&ids;
LAB_002c377d:
  std::__cxx11::string::~string((string *)pSVar11);
  bVar3 = false;
LAB_002c3785:
  uVar16 = 0;
LAB_002c3787:
  anon_unknown.dwarf_b986de::Defer::~Defer((Defer *)&ArgsParser);
  if (bVar3) {
LAB_002c379d:
    bVar3 = std::operator==(expArgs.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + expArg,"CALL");
    if (bVar3) {
      expArg = expArg + 1;
      bVar3 = cmCMakeLanguageCommand::anon_class_40_5_733c87e0::operator()(&moreArgs);
      sVar12 = rawArg;
      if (bVar3) {
        sVar1 = expArg + 1;
        if (sVar1 == (long)expArgs.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)expArgs.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5) {
          psVar6 = expArgs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + expArg;
          local_70 = false;
          expArg = sVar1;
          if (maybeDefer.super__Optional_base<(anonymous_namespace)::Defer,_false,_false>._M_payload
              .super__Optional_payload<(anonymous_namespace)::Defer,_true,_false,_false>.
              super__Optional_payload_base<(anonymous_namespace)::Defer>._M_engaged == true) {
            std::_Optional_payload_base<(anonymous_namespace)::Defer>::
            _M_construct<(anonymous_namespace)::Defer>
                      ((_Optional_payload_base<(anonymous_namespace)::Defer> *)local_b8,
                       (Defer *)&maybeDefer);
          }
          cmsys::SystemTools::LowerCase((string *)&ids,psVar6);
          psVar7 = std::
                   __find_if<cm::static_string_view_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                             ((anonymous_namespace)::InvalidCommands,
                              (anonymous_namespace)::InvalidDeferCommands,&ids);
          if (psVar7 == (static_string_view *)(anonymous_namespace)::InvalidDeferCommands) {
            if ((local_70 == true) &&
               (psVar7 = std::
                         __find_if<cm::static_string_view_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                                   ((anonymous_namespace)::InvalidDeferCommands,
                                    &cmsys::SystemToolsManagerInstance,&ids),
               psVar7 != (static_string_view *)&cmsys::SystemToolsManagerInstance)) {
              ArgsParser.super_Base.Bindings.Keywords.
              super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
              .
              super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)&DAT_0000001b;
              ArgsParser.super_Base.Bindings.Keywords.
              super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
              .
              super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)anon_var_dwarf_b99099;
              parsedArgs.Command._M_string_length = (size_type)(psVar6->_M_dataplus)._M_p;
              parsedArgs.Command._M_dataplus._M_p = (pointer)psVar6->_M_string_length;
              cmStrCat<>(&local_2d0.Command,(cmAlphaNum *)&ArgsParser,(cmAlphaNum *)&parsedArgs);
              anon_unknown.dwarf_b986de::FatalError(status,&local_2d0.Command);
              goto LAB_002c38bf;
            }
            pcVar15 = status->Makefile;
            cmMakefile::GetBacktrace((cmMakefile *)&parsedArgs);
            pcVar9 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Top
                               ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)&parsedArgs)
            ;
            cmListFileContext::cmListFileContext((cmListFileContext *)&ArgsParser,pcVar9);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       &parsedArgs.Command._M_string_length);
            unparsed.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            unparsed.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            unparsed.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::reserve
                      ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)&unparsed,
                       ((long)(args->
                              super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(args->
                             super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                             )._M_impl.super__Vector_impl_data._M_start) / 0x30 - sVar12);
            lVar14 = sVar12 * 0x30;
            for (; pcVar2 = (args->
                            super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                            )._M_impl.super__Vector_impl_data._M_start,
                sVar12 < (ulong)(((long)(args->
                                        super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                                        )._M_impl.super__Vector_impl_data._M_finish - (long)pcVar2)
                                / 0x30); sVar12 = sVar12 + 1) {
              std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>::
              emplace_back<std::__cxx11::string_const&,cmListFileArgument::Delimiter_const&,long&>
                        ((vector<cmListFileArgument,std::allocator<cmListFileArgument>> *)&unparsed,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&(pcVar2->Value)._M_dataplus._M_p + lVar14),
                         (Delimiter *)((long)&pcVar2->Delim + lVar14),
                         (long *)(ArgsParser.super_Base.Bindings.ParsedKeyword.super__Function_base.
                                  _M_functor._M_pod_data + 8));
              lVar14 = lVar14 + 0x30;
            }
            std::__cxx11::string::string((string *)&fcmasProperty,(string *)psVar6);
            methods.
            super__Vector_base<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)unparsed.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
            methods.
            super__Vector_base<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 (pointer)unparsed.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
            methods.
            super__Vector_base<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)unparsed.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage;
            unparsed.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            unparsed.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            unparsed.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            cmListFileFunction::cmListFileFunction
                      (&func,&fcmasProperty,
                       ArgsParser.super_Base.Bindings.ParsedKeyword.super__Function_base._M_functor.
                       _8_8_,ArgsParser.super_Base.Bindings.ParsedKeyword.super__Function_base.
                             _M_functor._8_8_,
                       (vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)&methods);
            std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector
                      ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)&methods);
            std::__cxx11::string::~string((string *)&fcmasProperty);
            if (local_70 == true) {
              if (local_b8._8_8_ == 0) {
                cmMakefile::NewDeferId_abi_cxx11_(&parsedArgs.Command,pcVar15);
                std::__cxx11::string::operator=((string *)local_b8,(string *)&parsedArgs);
                std::__cxx11::string::~string((string *)&parsedArgs);
              }
              if (local_b8._40_8_ != 0) {
                value_01._M_str = (char *)local_b8._0_8_;
                value_01._M_len = local_b8._8_8_;
                cmMakefile::AddDefinition(pcVar15,(string *)(local_b8 + 0x20),value_01);
              }
              if ((cmMakefile *)local_b8._64_8_ != (cmMakefile *)0x0) {
                pcVar15 = (cmMakefile *)local_b8._64_8_;
              }
              std::__cxx11::string::string((string *)&command,(string *)local_b8);
              std::__cxx11::string::string
                        ((string *)&local_1d8,
                         (string *)
                         (ArgsParser.super_Base.Bindings.KeywordMissingValue.super__Function_base.
                          _M_functor._M_pod_data + 8));
              std::
              __shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>::
              __shared_ptr(&local_c8,
                           (__shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                            *)&func);
              bVar3 = cmMakefile::DeferCall
                                (pcVar15,(string *)&command,&local_1d8,
                                 (cmListFileFunction *)&local_c8);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&local_c8._M_refcount);
              std::__cxx11::string::~string((string *)&local_1d8);
              std::__cxx11::string::~string((string *)&command);
              uVar16 = true;
              if (!bVar3) {
                parsedArgs.Command._M_dataplus._M_p = (pointer)0x30;
                parsedArgs.Command._M_string_length = (size_type)anon_var_dwarf_b990b2;
                psVar6 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(pcVar15);
                local_2d0.Command._M_string_length = (size_type)(psVar6->_M_dataplus)._M_p;
                local_2d0.Command._M_dataplus._M_p = (pointer)psVar6->_M_string_length;
                local_40.super_string_view._M_len = 0xe;
                local_40.super_string_view._M_str = "\nat this time.";
                cmStrCat<cm::static_string_view>
                          (&local_108,(cmAlphaNum *)&parsedArgs,(cmAlphaNum *)&local_2d0,&local_40);
                anon_unknown.dwarf_b986de::FatalError(status,&local_108);
                std::__cxx11::string::~string((string *)&local_108);
                uVar16 = false;
              }
            }
            else {
              parsedArgs.Methods.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)((ulong)parsedArgs.Methods.
                                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
              uVar16 = cmMakefile::ExecuteCommand
                                 (pcVar15,&func,status,
                                  (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&parsedArgs);
              std::
              _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&parsedArgs);
            }
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&func.Impl.
                        super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
            std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector
                      ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)&unparsed)
            ;
            cmListFileContext::~cmListFileContext((cmListFileContext *)&ArgsParser);
          }
          else {
            ArgsParser.super_Base.Bindings.Keywords.
            super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
            .
            super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)&DAT_0000001b;
            ArgsParser.super_Base.Bindings.Keywords.
            super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
            .
            super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)anon_var_dwarf_b99099;
            parsedArgs.Command._M_string_length = (size_type)(psVar6->_M_dataplus)._M_p;
            parsedArgs.Command._M_dataplus._M_p = (pointer)psVar6->_M_string_length;
            cmStrCat<>(&local_2d0.Command,(cmAlphaNum *)&ArgsParser,(cmAlphaNum *)&parsedArgs);
            anon_unknown.dwarf_b986de::FatalError(status,&local_2d0.Command);
LAB_002c38bf:
            std::__cxx11::string::~string((string *)&local_2d0);
            uVar16 = false;
          }
          std::__cxx11::string::~string((string *)&ids);
          std::_Optional_base<(anonymous_namespace)::Defer,_false,_false>::~_Optional_base
                    ((_Optional_base<(anonymous_namespace)::Defer,_false,_false> *)local_b8);
          goto LAB_002c4030;
        }
        expArg = sVar1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&ArgsParser,"CALL command\'s arguments must be literal",
                   (allocator<char> *)&parsedArgs);
        anon_unknown.dwarf_b986de::FatalError(status,(string *)&ArgsParser);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&ArgsParser,"CALL missing command name",(allocator<char> *)&parsedArgs)
        ;
        anon_unknown.dwarf_b986de::FatalError(status,(string *)&ArgsParser);
      }
LAB_002c3aaf:
      std::__cxx11::string::~string((string *)&ArgsParser);
      uVar16 = 0;
    }
    else {
      bVar3 = std::operator==(expArgs.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + expArg,"EVAL");
      if (!bVar3) {
        bVar3 = std::operator==(expArgs.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + expArg,
                                "GET_MESSAGE_LOG_LEVEL");
        if (!bVar3) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&ArgsParser,"called with unknown meta-operation",
                     (allocator<char> *)&parsedArgs);
          anon_unknown.dwarf_b986de::FatalError(status,(string *)&ArgsParser);
          goto LAB_002c3aaf;
        }
        pcVar15 = status->Makefile;
        parsedArgs.Command._M_dataplus._M_p = (pointer)0x0;
        parsedArgs.Command._M_string_length = 0;
        parsedArgs.Command.field_2._M_allocated_capacity = 0;
        cmMakefile::ExpandArguments
                  (pcVar15,args,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&parsedArgs);
        if (((ulong)(((long)(args->
                            super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(args->
                           super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                           )._M_impl.super__Vector_impl_data._M_start) / 0x30) < 2) ||
           (0x40 < parsedArgs.Command._M_string_length - (long)parsedArgs.Command._M_dataplus._M_p))
        {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&ArgsParser,
                     "sub-command GET_MESSAGE_LOG_LEVEL expects exactly one argument",
                     (allocator<char> *)&local_2d0);
          anon_unknown.dwarf_b986de::FatalError(status,(string *)&ArgsParser);
          std::__cxx11::string::~string((string *)&ArgsParser);
          uVar16 = 0;
        }
        else {
          LVar5 = cmMakefile::GetCurrentLogLevel(pcVar15);
          cmake::LogLevelToString_abi_cxx11_((string *)&ArgsParser,(cmake *)(ulong)LVar5,level);
          value_02._M_str =
               (char *)ArgsParser.super_Base.Bindings.Keywords.
                       super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                       .
                       super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
          value_02._M_len =
               (size_t)ArgsParser.super_Base.Bindings.Keywords.
                       super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                       .
                       super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
          cmMakefile::AddDefinition
                    (pcVar15,(string *)(parsedArgs.Command._M_dataplus._M_p + 0x20),value_02);
          std::__cxx11::string::~string((string *)&ArgsParser);
          uVar16 = 1;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&parsedArgs);
        goto LAB_002c4030;
      }
      pcVar15 = status->Makefile;
      cmMakefile::GetBacktrace((cmMakefile *)&parsedArgs);
      pcVar9 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Top
                         ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)&parsedArgs);
      cmListFileContext::cmListFileContext((cmListFileContext *)&ArgsParser,pcVar9);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&parsedArgs.Command._M_string_length)
      ;
      command.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
      command.super__Function_base._M_functor._8_8_ = 0;
      command.super__Function_base._M_manager = (_Manager_type)0x0;
      cmMakefile::ExpandArguments
                (pcVar15,args,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&command);
      if ((ulong)(command.super__Function_base._M_functor._8_8_ -
                 command.super__Function_base._M_functor._0_8_) < 0x21) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&parsedArgs,"called with incorrect number of arguments",
                   (allocator<char> *)&local_2d0);
        anon_unknown.dwarf_b986de::FatalError(status,&parsedArgs.Command);
LAB_002c3fa2:
        std::__cxx11::string::~string((string *)&parsedArgs);
        uVar16 = false;
      }
      else {
        bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(command.super__Function_base._M_functor._M_unused.
                                  _M_function_pointer + 0x20),"CODE");
        if (bVar3) {
          _Var8 = std::
                  __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[5]>>
                            (command.super__Function_base._M_functor._M_unused._M_function_pointer +
                             0x40,command.super__Function_base._M_functor._8_8_,"CODE");
          if (_Var8._M_current ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              command.super__Function_base._M_functor._8_8_) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&parsedArgs,"called without CODE argument",
                       (allocator<char> *)&local_2d0);
            anon_unknown.dwarf_b986de::FatalError(status,&parsedArgs.Command);
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&parsedArgs,
                       "called with unsupported arguments between EVAL and CODE arguments",
                       (allocator<char> *)&local_2d0);
            anon_unknown.dwarf_b986de::FatalError(status,&parsedArgs.Command);
          }
          goto LAB_002c3fa2;
        }
        parsedArgs.Command._M_dataplus._M_p =
             (pointer)(command.super__Function_base._M_functor._M_unused._M_member_pointer + 0x40);
        parsedArgs.Command._M_string_length = command.super__Function_base._M_functor._8_8_;
        separator._M_str = " ";
        separator._M_len = 1;
        cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                  ((string *)&ids,
                   (cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)&parsedArgs,separator);
        parsedArgs.Command._M_dataplus._M_p =
             (pointer)ArgsParser.super_Base.Bindings.KeywordMissingValue.super__Function_base.
                      _M_manager;
        parsedArgs.Command._M_string_length =
             ArgsParser.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_functor.
             _8_8_;
        local_2d0.Command._M_dataplus._M_p = &DAT_00000001;
        local_2d0.Command._M_string_length = 0x644ec7;
        cmStrCat<long,char[6]>
                  (&fcmasProperty,(cmAlphaNum *)&parsedArgs,(cmAlphaNum *)&local_2d0,
                   (long *)(ArgsParser.super_Base.Bindings.ParsedKeyword.super__Function_base.
                            _M_functor._M_pod_data + 8),(char (*) [6])":EVAL");
        uVar16 = cmMakefile::ReadListFileAsString(pcVar15,(string *)&ids,&fcmasProperty);
        std::__cxx11::string::~string((string *)&fcmasProperty);
        std::__cxx11::string::~string((string *)&ids);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&command);
      cmListFileContext::~cmListFileContext((cmListFileContext *)&ArgsParser);
    }
  }
LAB_002c4030:
  std::_Optional_base<(anonymous_namespace)::Defer,_false,_false>::~_Optional_base
            (&maybeDefer.super__Optional_base<(anonymous_namespace)::Defer,_false,_false>);
LAB_002c403d:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&expArgs);
  return (bool)uVar16;
}

Assistant:

bool cmCMakeLanguageCommand(std::vector<cmListFileArgument> const& args,
                            cmExecutionStatus& status)
{
  std::vector<std::string> expArgs;
  size_t rawArg = 0;
  size_t expArg = 0;

  // Helper to consume and expand one raw argument at a time.
  auto moreArgs = [&]() -> bool {
    while (expArg >= expArgs.size()) {
      if (rawArg >= args.size()) {
        return false;
      }
      std::vector<cmListFileArgument> tmpArg;
      tmpArg.emplace_back(args[rawArg++]);
      status.GetMakefile().ExpandArguments(tmpArg, expArgs);
    }
    return true;
  };
  auto finishArgs = [&]() {
    std::vector<cmListFileArgument> tmpArgs(args.begin() + rawArg, args.end());
    status.GetMakefile().ExpandArguments(tmpArgs, expArgs);
    rawArg = args.size();
  };

  if (!moreArgs()) {
    return FatalError(status, "called with incorrect number of arguments");
  }

  if (expArgs[expArg] == "SET_DEPENDENCY_PROVIDER"_s) {
    finishArgs();
    return cmCMakeLanguageCommandSET_DEPENDENCY_PROVIDER(expArgs, status);
  }

  cm::optional<Defer> maybeDefer;
  if (expArgs[expArg] == "DEFER"_s) {
    ++expArg; // Consume "DEFER".

    if (!moreArgs()) {
      return FatalError(status, "DEFER requires at least one argument");
    }

    Defer defer;

    // Process optional arguments.
    while (moreArgs()) {
      if (expArgs[expArg] == "CALL"_s) {
        break;
      }
      if (expArgs[expArg] == "CANCEL_CALL"_s ||
          expArgs[expArg] == "GET_CALL_IDS"_s ||
          expArgs[expArg] == "GET_CALL"_s) {
        if (!defer.Id.empty() || !defer.IdVar.empty()) {
          return FatalError(status,
                            cmStrCat("DEFER "_s, expArgs[expArg],
                                     " does not accept ID or ID_VAR."_s));
        }
        finishArgs();
        return cmCMakeLanguageCommandDEFER(defer, expArgs, expArg, status);
      }
      if (expArgs[expArg] == "DIRECTORY"_s) {
        ++expArg; // Consume "DIRECTORY".
        if (defer.Directory) {
          return FatalError(status,
                            "DEFER given multiple DIRECTORY arguments");
        }
        if (!moreArgs()) {
          return FatalError(status, "DEFER DIRECTORY missing value");
        }
        std::string dir = expArgs[expArg++];
        if (dir.empty()) {
          return FatalError(status, "DEFER DIRECTORY may not be empty");
        }
        dir = cmSystemTools::CollapseFullPath(
          dir, status.GetMakefile().GetCurrentSourceDirectory());
        defer.Directory =
          status.GetMakefile().GetGlobalGenerator()->FindMakefile(dir);
        if (!defer.Directory) {
          return FatalError(status,
                            cmStrCat("DEFER DIRECTORY:\n  "_s, dir,
                                     "\nis not known.  "_s,
                                     "It may not have been processed yet."_s));
        }
      } else if (expArgs[expArg] == "ID"_s) {
        ++expArg; // Consume "ID".
        if (!defer.Id.empty()) {
          return FatalError(status, "DEFER given multiple ID arguments");
        }
        if (!moreArgs()) {
          return FatalError(status, "DEFER ID missing value");
        }
        defer.Id = expArgs[expArg++];
        if (defer.Id.empty()) {
          return FatalError(status, "DEFER ID may not be empty");
        }
        if (defer.Id[0] >= 'A' && defer.Id[0] <= 'Z') {
          return FatalError(status, "DEFER ID may not start in A-Z.");
        }
      } else if (expArgs[expArg] == "ID_VAR"_s) {
        ++expArg; // Consume "ID_VAR".
        if (!defer.IdVar.empty()) {
          return FatalError(status, "DEFER given multiple ID_VAR arguments");
        }
        if (!moreArgs()) {
          return FatalError(status, "DEFER ID_VAR missing variable name");
        }
        defer.IdVar = expArgs[expArg++];
        if (defer.IdVar.empty()) {
          return FatalError(status, "DEFER ID_VAR may not be empty");
        }
      } else {
        return FatalError(
          status, cmStrCat("DEFER unknown option:\n  "_s, expArgs[expArg]));
      }
    }

    if (!(moreArgs() && expArgs[expArg] == "CALL"_s)) {
      return FatalError(status, "DEFER must be followed by a CALL argument");
    }

    maybeDefer = std::move(defer);
  }

  if (expArgs[expArg] == "CALL") {
    ++expArg; // Consume "CALL".

    // CALL requires a command name.
    if (!moreArgs()) {
      return FatalError(status, "CALL missing command name");
    }
    std::string const& callCommand = expArgs[expArg++];

    // CALL accepts no further expanded arguments.
    if (expArg != expArgs.size()) {
      return FatalError(status, "CALL command's arguments must be literal");
    }

    // Run the CALL.
    return cmCMakeLanguageCommandCALL(args, callCommand, rawArg,
                                      std::move(maybeDefer), status);
  }

  if (expArgs[expArg] == "EVAL") {
    return cmCMakeLanguageCommandEVAL(args, status);
  }

  if (expArgs[expArg] == "GET_MESSAGE_LOG_LEVEL") {
    return cmCMakeLanguageCommandGET_MESSAGE_LOG_LEVEL(args, status);
  }

  return FatalError(status, "called with unknown meta-operation");
}